

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void CalcResizePosSizeFromAnyCorner
               (ImGuiWindow *window,ImVec2 *corner_target,ImVec2 *corner_norm,ImVec2 *out_pos,
               ImVec2 *out_size)

{
  ImVec2 new_size;
  ImVec2 IVar1;
  float local_58;
  float fStack_54;
  ImVec2 size_constrained;
  ImVec2 size_expected;
  ImVec2 local_40;
  ImVec2 pos_max;
  ImVec2 pos_min;
  ImVec2 *out_size_local;
  ImVec2 *out_pos_local;
  ImVec2 *corner_norm_local;
  ImVec2 *corner_target_local;
  ImGuiWindow *window_local;
  
  pos_max = ImLerp(corner_target,&window->Pos,corner_norm);
  size_expected = operator+(&window->Pos,&window->Size);
  local_40 = ImLerp(&size_expected,corner_target,corner_norm);
  new_size = operator-(&local_40,&pos_max);
  IVar1 = CalcWindowSizeAfterConstraint(window,new_size);
  *out_pos = pos_max;
  if ((corner_norm->x == 0.0) && (!NAN(corner_norm->x))) {
    local_58 = IVar1.x;
    size_constrained.x = new_size.x;
    out_pos->x = out_pos->x - (local_58 - size_constrained.x);
  }
  if ((corner_norm->y == 0.0) && (!NAN(corner_norm->y))) {
    fStack_54 = IVar1.y;
    size_constrained.y = new_size.y;
    out_pos->y = out_pos->y - (fStack_54 - size_constrained.y);
  }
  *out_size = IVar1;
  return;
}

Assistant:

static void CalcResizePosSizeFromAnyCorner(ImGuiWindow* window, const ImVec2& corner_target, const ImVec2& corner_norm, ImVec2* out_pos, ImVec2* out_size)
{
    ImVec2 pos_min = ImLerp(corner_target, window->Pos, corner_norm);                // Expected window upper-left
    ImVec2 pos_max = ImLerp(window->Pos + window->Size, corner_target, corner_norm); // Expected window lower-right
    ImVec2 size_expected = pos_max - pos_min;
    ImVec2 size_constrained = CalcWindowSizeAfterConstraint(window, size_expected);
    *out_pos = pos_min;
    if (corner_norm.x == 0.0f)
        out_pos->x -= (size_constrained.x - size_expected.x);
    if (corner_norm.y == 0.0f)
        out_pos->y -= (size_constrained.y - size_expected.y);
    *out_size = size_constrained;
}